

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O2

ConstantMap * __thiscall
OSTEI_VRR_Writer::GetConstants_abi_cxx11_
          (ConstantMap *__return_storage_ptr__,OSTEI_VRR_Writer *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  int local_74;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar3 = 1;
  while( true ) {
    local_74 = iVar3;
    iVar2 = OSTEI_VRR_Algorithm_Base::GetMaxInt(this->vrr_algo_);
    if (iVar2 < iVar3) break;
    StringBuilder<char[7],int&>(&local_50,(char (*) [7])0x139bfb,&local_74);
    std::__cxx11::to_string(&local_70,local_74);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)__return_storage_ptr__,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    iVar3 = local_74 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantMap OSTEI_VRR_Writer::GetConstants(void) const
{
    ConstantMap cm;
    for(int i = 1; i <= vrr_algo_.GetMaxInt(); i++)
        cm.emplace(StringBuilder("const_", i), StringBuilder(i));
    return cm;
}